

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall
GEO::Delaunay3dThread::Delaunay3dThread
          (Delaunay3dThread *this,ParallelDelaunay3d *master,index_t pool_begin,index_t pool_end)

{
  bool bVar1;
  pointer puVar2;
  pointer pdVar3;
  pointer puVar4;
  vector<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
  *pvVar5;
  vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_> *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  index_t t;
  pointer puVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  pointer pdVar14;
  index_t iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  *(undefined8 *)&(this->super_Thread).super_Counted.nb_refs_ = 0;
  (this->super_Thread).super_Counted._vptr_Counted = (_func_int **)&PTR__Delaunay3dThread_001a9a28;
  pvVar5 = &(this->S2_).store_;
  (pvVar5->
  super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar5->
  super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->S2_).store_.
  super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->master_ = master;
  this->cell_to_v_store_ = &master->cell_to_v_store_;
  this->cell_to_cell_store_ = &master->cell_to_cell_store_;
  this->cell_next_ = &master->cell_next_;
  this->cell_thread_ = &master->cell_thread_;
  pvVar6 = &(this->S_).super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
  ;
  (pvVar6->super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar6->super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->S_).super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
  super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cavity_).nb_f_ = 0;
  pvVar6 = &(this->tets_to_delete_).
            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>;
  (pvVar6->super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar6->super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->tets_to_delete_).
    super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
    super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar6 = &(this->tets_to_release_).
            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>;
  (pvVar6->super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar6->super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cavity_).OK_ = true;
  memset(&this->cavity_,0xff,0x400);
  this->max_used_t_ = 1;
  puVar2 = (master->cell_next_).
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this->max_t_ = (index_t)((ulong)((long)(master->cell_next_).
                                         super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                                         .
                                         super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2)
                          >> 2);
  this->nb_vertices_ = (master->super_Delaunay).nb_vertices_;
  this->vertices_ = (master->super_Delaunay).vertices_;
  bVar1 = master->weighted_;
  this->weighted_ = bVar1;
  pdVar14 = (pointer)0x0;
  if (bVar1 == true) {
    pdVar3 = (master->heights_).super_vector<double,_GEO::Memory::aligned_allocator<double,_64>_>.
             super__Vector_base<double,_GEO::Memory::aligned_allocator<double,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar14 = (pointer)((long)(master->heights_).
                              super_vector<double,_GEO::Memory::aligned_allocator<double,_64>_>.
                              super__Vector_base<double,_GEO::Memory::aligned_allocator<double,_64>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar3 &
                       0x7fffffff8);
    if (pdVar14 != (pointer)0x0) {
      pdVar14 = pdVar3;
    }
  }
  this->heights_ = pdVar14;
  uVar9 = (uint)(byte)(master->super_Delaunay).super_Counted.field_0xc;
  this->dimension_ = uVar9;
  this->vertex_stride_ = uVar9;
  puVar4 = (master->reorder_).
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar10 = (pointer)((long)(master->reorder_).
                            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                            .
                            super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 & 0x3fffffffc)
  ;
  if (puVar10 != (pointer)0x0) {
    puVar10 = puVar4;
  }
  this->reorder_ = puVar10;
  this->first_free_ = pool_begin;
  auVar8 = _DAT_0018d020;
  auVar7 = _DAT_0018d010;
  uVar9 = pool_end - 1;
  if (pool_begin < uVar9) {
    uVar11 = (ulong)pool_begin;
    lVar12 = (uVar9 - uVar11) + -1;
    iVar16 = pool_begin + 1;
    auVar17._8_4_ = (int)lVar12;
    auVar17._0_8_ = lVar12;
    auVar17._12_4_ = (int)((ulong)lVar12 >> 0x20);
    uVar13 = 0;
    auVar17 = auVar17 ^ _DAT_0018d020;
    iVar15 = pool_begin;
    do {
      auVar18._8_4_ = (int)uVar13;
      auVar18._0_8_ = uVar13;
      auVar18._12_4_ = (int)(uVar13 >> 0x20);
      auVar18 = (auVar18 | auVar7) ^ auVar8;
      if ((bool)(~(auVar18._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar18._0_4_ ||
                  auVar17._4_4_ < auVar18._4_4_) & 1)) {
        puVar2[uVar11 + uVar13] = iVar15 + 1;
      }
      if ((auVar18._12_4_ != auVar17._12_4_ || auVar18._8_4_ <= auVar17._8_4_) &&
          auVar18._12_4_ <= auVar17._12_4_) {
        puVar2[uVar11 + uVar13 + 1] = iVar16 + 1;
      }
      uVar13 = uVar13 + 2;
      iVar15 = iVar15 + 2;
      iVar16 = iVar16 + 2;
    } while (((uVar9 - uVar11) + 1 & 0xfffffffffffffffe) != uVar13);
  }
  puVar2[uVar9] = 0xffffffff;
  this->nb_free_ = pool_end - pool_begin;
  this->memory_overflow_ = false;
  this->work_begin_ = -1;
  this->work_end_ = -1;
  this->finished_ = false;
  this->interfering_thread_ = 0xff;
  this->b_hint_ = 0xffffffff;
  this->e_hint_ = 0xffffffff;
  this->direction_ = true;
  this->nb_rollbacks_ = 0;
  this->nb_failed_locate_ = 0;
  this->nb_tets_to_create_ = 0;
  this->t_boundary_ = 0xffffffff;
  this->f_boundary_ = 0xffffffff;
  this->v1_ = 0xffffffff;
  this->v2_ = 0xffffffff;
  this->v3_ = 0xffffffff;
  this->v4_ = 0xffffffff;
  pthread_cond_init((pthread_cond_t *)&this->cond_,(pthread_condattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&this->mutex_,(pthread_mutexattr_t *)0x0);
  return;
}

Assistant:

Delaunay3dThread(
            ParallelDelaunay3d* master,
            index_t pool_begin,
            index_t pool_end
        ) : 
            master_(master),
            cell_to_v_store_(master_->cell_to_v_store_),
            cell_to_cell_store_(master_->cell_to_cell_store_),
            cell_next_(master_->cell_next_),
            cell_thread_(master_->cell_thread_)
        {

            // max_used_t_ is initialized to 1 so that
            // computing modulos does not trigger FPEs
            // at the beginning.
            max_used_t_ = 1;
            max_t_ = master_->cell_next_.size();

            nb_vertices_ = master_->nb_vertices();
            vertices_ = master_->vertex_ptr(0);
            weighted_ = master_->weighted_;
            heights_ = weighted_ ? master_->heights_.data() : nullptr;
            dimension_ = master_->dimension();
            vertex_stride_ = dimension_;
            reorder_ = master_->reorder_.data();

            // Initialize free list in memory pool
            first_free_ = pool_begin;
            for(index_t t=pool_begin; t<pool_end-1; ++t) {
                cell_next_[t] = t+1;
            }
            cell_next_[pool_end-1] = END_OF_LIST;
            nb_free_ = pool_end - pool_begin;
            memory_overflow_ = false;

            work_begin_ = -1;
            work_end_ = -1;
            finished_ = false;
            b_hint_ = NO_TETRAHEDRON;
            e_hint_ = NO_TETRAHEDRON;
            direction_ = true;

#ifdef GEO_DEBUG
            nb_acquired_tets_ = 0;
#endif
            interfering_thread_ = NO_THREAD;

            nb_rollbacks_ = 0;
            nb_failed_locate_ = 0;

            nb_tets_to_create_ = 0;
            t_boundary_ = NO_TETRAHEDRON;
            f_boundary_ = index_t(-1);

            v1_ = index_t(-1);
            v2_ = index_t(-1);
            v3_ = index_t(-1);
            v4_ = index_t(-1);

            pthread_cond_init(&cond_, nullptr);
            pthread_mutex_init(&mutex_, nullptr);
        }